

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int RWops12to20_close(SDL_RWops *rwops20)

{
  int iVar1;
  
  if (rwops20 != (SDL_RWops *)0x0) {
    iVar1 = (**(code **)((rwops20->hidden).mem.base + 0x18))();
    (*SDL20_FreeRW)(rwops20);
    return iVar1;
  }
  return 0;
}

Assistant:

static int SDLCALL
RWops12to20_close(struct SDL_RWops *rwops20)
{
    int rc = 0;
    if (rwops20) {
        SDL12_RWops *rwops12 = (SDL12_RWops *) rwops20->hidden.unknown.data1;
        rc = rwops12->close(rwops12);
        SDL20_FreeRW(rwops20);
    }
    return rc;
}